

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O2

void wasm::PrintExpressionContents::printRMWSize(ostream *o,Type type,uint8_t bytes)

{
  uint uVar1;
  ostream *poVar2;
  Type type_00;
  char *pcVar3;
  Type local_28;
  Type type_local;
  
  local_28.id = type.id;
  poVar2 = prepareColor(o);
  type_00.id = 2;
  if (2 < type.id) {
    type_00.id = type.id;
  }
  poVar2 = wasm::operator<<(poVar2,type_00);
  std::operator<<(poVar2,".atomic.rmw");
  if (type.id != 1) {
    uVar1 = wasm::Type::getByteSize(&local_28);
    if (uVar1 != bytes) {
      if (bytes == '\x04') {
        pcVar3 = "32";
      }
      else {
        if (bytes != 2) {
          if (bytes != '\x01') {
            handle_unreachable("invalid RMW byte length",
                               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Print.cpp"
                               ,0x29d);
          }
          std::operator<<(o,'8');
          goto LAB_00b22229;
        }
        pcVar3 = "16";
      }
      std::operator<<(o,pcVar3);
    }
  }
LAB_00b22229:
  std::operator<<(o,'.');
  return;
}

Assistant:

static void printRMWSize(std::ostream& o, Type type, uint8_t bytes) {
    prepareColor(o) << forceConcrete(type) << ".atomic.rmw";
    if (type != Type::unreachable && bytes != type.getByteSize()) {
      if (bytes == 1) {
        o << '8';
      } else if (bytes == 2) {
        o << "16";
      } else if (bytes == 4) {
        o << "32";
      } else {
        WASM_UNREACHABLE("invalid RMW byte length");
      }
    }
    o << '.';
  }